

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O2

void compact_upto_post_snapshot_test(void)

{
  fdb_kvs_handle *handle;
  fdb_status fVar1;
  size_t keylen;
  int iVar2;
  char *__format;
  uint uVar3;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  fdb_snapshot_info_t *markers;
  fdb_kvs_info kvs_info;
  uint64_t num_markers;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char keybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  rdoc = (fdb_doc *)0x0;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.block_reusing_threshold = 0;
  fdb_open(&dbfile,"./compact_test1",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  for (uVar3 = 0; uVar3 != 10; uVar3 = uVar3 + 1) {
    sprintf(keybuf,"key%d",(ulong)uVar3);
    handle = db;
    keylen = strlen(keybuf);
    fVar1 = fdb_set_kv(handle,keybuf,keylen,"value",5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xabf);
      compact_upto_post_snapshot_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xabf,"void compact_upto_post_snapshot_test()");
    }
    fdb_commit(dbfile,'\x01');
  }
  fVar1 = fdb_get_kvs_info(db,&kvs_info);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xac5);
    compact_upto_post_snapshot_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xac5,"void compact_upto_post_snapshot_test()");
  }
  if (kvs_info.last_seqnum != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
           );
    compact_upto_post_snapshot_test()::__test_pass = '\x01';
    if (kvs_info.last_seqnum != 10) {
      __assert_fail("kvs_info.last_seqnum == 10",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xac6,"void compact_upto_post_snapshot_test()");
    }
  }
  fVar1 = fdb_snapshot_open(db,&snap_db,5);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xaca);
    compact_upto_post_snapshot_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xaca,"void compact_upto_post_snapshot_test()");
  }
  fVar1 = fdb_get_kvs_info(snap_db,&kvs_info);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xace);
    compact_upto_post_snapshot_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xace,"void compact_upto_post_snapshot_test()");
  }
  if (kvs_info.last_seqnum != 5) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
           );
    compact_upto_post_snapshot_test()::__test_pass = '\x01';
    if (kvs_info.last_seqnum != 5) {
      __assert_fail("kvs_info.last_seqnum == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xacf,"void compact_upto_post_snapshot_test()");
    }
  }
  fVar1 = fdb_get_all_snap_markers(dbfile,&markers,&num_markers);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xad5);
    compact_upto_post_snapshot_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xad5,"void compact_upto_post_snapshot_test()");
  }
  fVar1 = fdb_compact_upto(dbfile,(char *)0x0,markers[5].marker);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xad7);
    compact_upto_post_snapshot_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xad7,"void compact_upto_post_snapshot_test()");
  }
  fVar1 = fdb_free_snap_markers(markers,num_markers);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_get_kvs_info(db,&kvs_info);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xadd);
      compact_upto_post_snapshot_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xadd,"void compact_upto_post_snapshot_test()");
    }
    if (kvs_info.last_seqnum != 10) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
             );
      compact_upto_post_snapshot_test()::__test_pass = '\x01';
      if (kvs_info.last_seqnum != 10) {
        __assert_fail("kvs_info.last_seqnum == 10",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xade,"void compact_upto_post_snapshot_test()");
      }
    }
    fVar1 = fdb_get_kvs_info(snap_db,&kvs_info);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xae0);
      compact_upto_post_snapshot_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xae0,"void compact_upto_post_snapshot_test()");
    }
    if (kvs_info.last_seqnum != 5) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
             );
      compact_upto_post_snapshot_test()::__test_pass = '\x01';
      if (kvs_info.last_seqnum != 5) {
        __assert_fail("kvs_info.last_seqnum == 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xae1,"void compact_upto_post_snapshot_test()");
      }
    }
    fVar1 = fdb_iterator_init(snap_db,&iterator,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      iVar2 = 5;
      while( true ) {
        fVar1 = fdb_iterator_get(iterator,&rdoc);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xaeb);
          compact_upto_post_snapshot_test()::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xaeb,"void compact_upto_post_snapshot_test()");
        }
        fdb_doc_free(rdoc);
        rdoc = (fdb_doc *)0x0;
        fVar1 = fdb_get_kvs_info(db,&kvs_info);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xaf2);
          compact_upto_post_snapshot_test()::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xaf2,"void compact_upto_post_snapshot_test()");
        }
        if (kvs_info.last_seqnum != 10) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xaf3);
          compact_upto_post_snapshot_test()::__test_pass = '\x01';
          if (kvs_info.last_seqnum != 10) {
            __assert_fail("kvs_info.last_seqnum == 10",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0xaf3,"void compact_upto_post_snapshot_test()");
          }
        }
        fVar1 = fdb_get_kvs_info(snap_db,&kvs_info);
        if (fVar1 != FDB_RESULT_SUCCESS) break;
        if (kvs_info.last_seqnum != 5) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xaf6);
          compact_upto_post_snapshot_test()::__test_pass = '\x01';
          if (kvs_info.last_seqnum != 5) {
            __assert_fail("kvs_info.last_seqnum == 5",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0xaf6,"void compact_upto_post_snapshot_test()");
          }
        }
        fVar1 = fdb_iterator_next(iterator);
        iVar2 = iVar2 + -1;
        if (fVar1 == FDB_RESULT_ITERATOR_FAIL) {
          if (iVar2 == 0) {
            fdb_iterator_close(iterator);
            fdb_kvs_close(snap_db);
            fdb_close(dbfile);
            fdb_shutdown();
            memleak_end();
            __format = "%s PASSED\n";
            if (compact_upto_post_snapshot_test()::__test_pass != '\0') {
              __format = "%s FAILED\n";
            }
            fprintf(_stderr,__format,"compact upto post snapshot test");
            return;
          }
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xaf9);
          compact_upto_post_snapshot_test()::__test_pass = 1;
          __assert_fail("i == 5",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xaf9,"void compact_upto_post_snapshot_test()");
        }
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xaf5);
      compact_upto_post_snapshot_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xaf5,"void compact_upto_post_snapshot_test()");
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xae7);
    compact_upto_post_snapshot_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xae7,"void compact_upto_post_snapshot_test()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
          ,0xad9);
  compact_upto_post_snapshot_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xad9,"void compact_upto_post_snapshot_test()");
}

Assistant:

void compact_upto_post_snapshot_test()
{
    TEST_INIT();
    memleak_start();
    int i, r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *snap_db;
    fdb_snapshot_info_t *markers;
    fdb_status status;
    fdb_iterator *iterator;
    fdb_doc *rdoc = NULL;
    fdb_kvs_info kvs_info;
    uint64_t num_markers;
    char keybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL " compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    // prevent block reusing to keep snapshots
    fconfig.block_reusing_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    for (i=0;i<10;++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    }

    // check  db info
    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(kvs_info.last_seqnum == 10);

    // open snapshot at seqnum 5
    status = fdb_snapshot_open(db, &snap_db, 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // check snap info
    status = fdb_get_kvs_info(snap_db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(kvs_info.last_seqnum == 5);


    // compact upto
    status = fdb_get_all_snap_markers(dbfile, &markers,
                                      &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_compact_upto(dbfile, NULL, markers[5].marker);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // check db and snap info
    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(kvs_info.last_seqnum == 10);
    status = fdb_get_kvs_info(snap_db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(kvs_info.last_seqnum == 5);


    // iterate over snapshot
    status = fdb_iterator_init(snap_db,
                               &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i = 0;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;

        // check db and snap info
        status = fdb_get_kvs_info(db, &kvs_info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(kvs_info.last_seqnum == 10);
        status = fdb_get_kvs_info(snap_db, &kvs_info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(kvs_info.last_seqnum == 5);
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);

    TEST_CHK(i == 5);

    fdb_iterator_close(iterator);
    fdb_kvs_close(snap_db);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("compact upto post snapshot test");
}